

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O3

void duckdb::ParquetDecodeUtils::BitUnpackAlignedInternal<unsigned_long>
               (ByteBuffer *src,unsigned_long *dst,idx_t count,bitpacking_width_t width)

{
  ulong uVar1;
  idx_t next_read;
  ulong uVar2;
  data_ptr_t src_00;
  unsigned_long aligned_data [32];
  uint32_t local_138 [66];
  
  src_00 = src->ptr;
  if (((ulong)src_00 & 7) == 0) {
    if (count != 0) {
      uVar1 = 0;
      uVar2 = 0;
      do {
        duckdb_fastpforlib::fastunpack((uint32_t *)(src_00 + (uVar1 >> 3)),dst,(uint)width);
        uVar2 = uVar2 + 0x20;
        uVar1 = uVar1 + (ulong)width * 0x20;
        dst = dst + 0x20;
      } while (uVar2 < count);
      src_00 = src->ptr;
    }
    uVar1 = (count * width) / 8;
    src->len = src->len - uVar1;
    src->ptr = src_00 + uVar1;
  }
  else if (count != 0) {
    uVar1 = 0;
    uVar2 = (ulong)(ushort)(((uint)width << 5) / 8);
    do {
      FastMemcpy(local_138,src_00,uVar2);
      duckdb_fastpforlib::fastunpack(local_138,dst,(uint)width);
      src->len = src->len - uVar2;
      src_00 = src->ptr + uVar2;
      src->ptr = src_00;
      dst = dst + 0x20;
      uVar1 = uVar1 + 0x20;
    } while (uVar1 < count);
  }
  return;
}

Assistant:

static void BitUnpackAlignedInternal(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		D_ASSERT(count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
		if (cast_pointer_to_uint64(src.ptr) % sizeof(T) == 0) {
			// Fast path: aligned
			BitpackingPrimitives::UnPackBuffer<T>(data_ptr_cast(dst), src.ptr, count, width);
			src.unsafe_inc(count * width / BITPACK_DLEN);
			return;
		}

		for (idx_t i = 0; i < count; i += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			const auto next_read = BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE * width / BITPACK_DLEN;

			// Buffer for alignment
			T aligned_data[BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE];

			// Copy over to aligned buffer
			FastMemcpy(aligned_data, src.ptr, next_read);

			// Unpack
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(dst), data_ptr_cast(aligned_data), width, true);

			src.unsafe_inc(next_read);
			dst += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}